

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O1

QWidget * __thiscall
QLineEditPrivate::addAction
          (QLineEditPrivate *this,QAction *newAction,QAction *before,ActionPosition position,
          int flags)

{
  QWidget *parent;
  void **ppvVar1;
  pointer pSVar2;
  pointer pSVar3;
  undefined4 *puVar4;
  QWidgetAction *this_00;
  QLineEditIconButton *this_01;
  SideWidgetLocation SVar5;
  pointer pSVar6;
  uint uVar7;
  const_iterator __position;
  SideWidgetEntryList *this_02;
  long in_FS_OFFSET;
  Connection local_70;
  Connection local_68;
  code *local_60;
  ImplFn local_58;
  value_type local_50;
  long local_38;
  
  SVar5.index = 0;
  SVar5.position = position;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (newAction == (QAction *)0x0) {
    this_01 = (QLineEditIconButton *)0x0;
  }
  else {
    parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    if (((this->leadingSideWidgets).
         super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->leadingSideWidgets).
         super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((this->trailingSideWidgets).
        super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->trailingSideWidgets).
        super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_50.widget = (QWidget *)QLineEdit::textChanged;
      local_50.action = (QAction *)0x0;
      local_60 = textChanged;
      local_58 = (ImplFn)0x0;
      puVar4 = (undefined4 *)operator_new(0x20);
      *puVar4 = 1;
      *(code **)(puVar4 + 2) =
           QtPrivate::
           QPrivateSlotObject<void_(QLineEditPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
           ::impl;
      *(code **)(puVar4 + 4) = textChanged;
      *(undefined8 *)(puVar4 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_68,(void **)parent,(QObject *)&local_50,(void **)parent,
                 (QSlotObjectBase *)&local_60,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection(&local_68);
      QLineEdit::text((QString *)&local_50,(QLineEdit *)parent);
      this->lastTextSize = local_50.flags;
      if ((QLineEditIconButton *)local_50.widget != (QLineEditIconButton *)0x0) {
        LOCK();
        *(int *)&(((QToolButton *)&(local_50.widget)->super_QObject)->super_QAbstractButton).
                 super_QWidget =
             *(int *)&(((QToolButton *)&(local_50.widget)->super_QObject)->super_QAbstractButton).
                      super_QWidget + -1;
        UNLOCK();
        if (*(int *)&(((QToolButton *)&(local_50.widget)->super_QObject)->super_QAbstractButton).
                     super_QWidget == 0) {
          QArrayData::deallocate((QArrayData *)local_50.widget,2,0x10);
        }
      }
    }
    this_00 = (QWidgetAction *)QMetaObject::cast((QObject *)&QWidgetAction::staticMetaObject);
    if (this_00 == (QWidgetAction *)0x0) {
      this_01 = (QLineEditIconButton *)0x0;
    }
    else {
      this_01 = (QLineEditIconButton *)QWidgetAction::requestWidget(this_00,parent);
      if (this_01 != (QLineEditIconButton *)0x0) {
        flags = flags | 2;
      }
    }
    if (this_01 == (QLineEditIconButton *)0x0) {
      this_01 = (QLineEditIconButton *)operator_new(0x38);
      QToolButton::QToolButton((QToolButton *)this_01,parent);
      *(undefined ***)&(this_01->super_QToolButton).super_QAbstractButton.super_QWidget =
           &PTR_metaObject_00802668;
      *(undefined ***)
       &(this_01->super_QToolButton).super_QAbstractButton.super_QWidget.super_QPaintDevice =
           &PTR__QLineEditIconButton_00802838;
      this_01->m_opacity = 0.0;
      this_01->m_hideWithText = false;
      this_01->m_fadingOut = false;
      QWidget::setFocusPolicy((QWidget *)this_01,NoFocus);
      QAction::icon();
      QAbstractButton::setIcon((QAbstractButton *)this_01,(QIcon *)&local_50);
      QIcon::~QIcon((QIcon *)&local_50);
      QLineEditIconButton::setOpacity(this_01,(double)((flags & 1U) == 0 || 0 < this->lastTextSize))
      ;
      if ((flags & 4U) != 0) {
        local_50.widget = (QWidget *)QAbstractButton::clicked;
        local_50.action = (QAction *)0x0;
        local_60 = clearButtonClicked;
        local_58 = (ImplFn)0x0;
        ppvVar1 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
        puVar4 = (undefined4 *)operator_new(0x20);
        *puVar4 = 1;
        *(code **)(puVar4 + 2) =
             QtPrivate::QPrivateSlotObject<void_(QLineEditPrivate::*)(),_QtPrivate::List<>,_void>::
             impl;
        *(code **)(puVar4 + 4) = clearButtonClicked;
        *(undefined8 *)(puVar4 + 6) = 0;
        QObject::connectImpl
                  ((QObject *)&local_70,(void **)this_01,(QObject *)&local_50,ppvVar1,
                   (QSlotObjectBase *)&local_60,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0
                  );
        QMetaObject::Connection::~Connection(&local_70);
        this_01->m_hideWithText = true;
      }
      QToolButton::setDefaultAction((QToolButton *)this_01,newAction);
    }
    if (((before == (QAction *)0x0) && (before = (QAction *)0x0, position == TrailingPosition)) &&
       ((flags & 4U) == 0)) {
      pSVar2 = (this->trailingSideWidgets).
               super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 = (this->trailingSideWidgets).
               super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar2 == pSVar3) {
        before = (QAction *)0x0;
      }
      else {
        before = (QAction *)0x0;
        do {
          pSVar6 = pSVar2 + 1;
          if ((pSVar2->flags & 4) != 0) {
            before = pSVar2->action;
            break;
          }
          pSVar2 = pSVar6;
        } while (pSVar6 != pSVar3);
      }
    }
    if (before == (QAction *)0x0) {
      uVar7 = 0xffffffff;
    }
    else {
      SVar5 = findSideWidget(this,before);
      uVar7 = SVar5.index;
    }
    this_02 = &this->leadingSideWidgets;
    if (SVar5.position == TrailingPosition) {
      this_02 = &this->trailingSideWidgets;
    }
    if ((int)uVar7 < 0) {
      __position._M_current =
           (this_02->
           super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      __position._M_current =
           (this_02->
           super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
           )._M_impl.super__Vector_impl_data._M_start + uVar7;
    }
    local_50.widget = (QWidget *)this_01;
    local_50.action = newAction;
    local_50.flags = flags;
    std::
    vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>::
    _M_insert_rval(this_02,__position,&local_50);
    positionSideWidgets(this);
    QWidget::show((QWidget *)this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QWidget *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QLineEditPrivate::addAction(QAction *newAction, QAction *before, QLineEdit::ActionPosition position, int flags)
{
    Q_Q(QLineEdit);
    if (!newAction)
        return nullptr;
    if (!hasSideWidgets()) { // initial setup.
        QObjectPrivate::connect(q, &QLineEdit::textChanged,
                                this, &QLineEditPrivate::textChanged);
        lastTextSize = q->text().size();
    }
    QWidget *w = nullptr;
    // Store flags about QWidgetAction here since removeAction() may be called from ~QAction,
    // in which a qobject_cast<> no longer works.
    if (QWidgetAction *widgetAction = qobject_cast<QWidgetAction *>(newAction)) {
        if ((w = widgetAction->requestWidget(q)))
            flags |= SideWidgetCreatedByWidgetAction;
    }
    if (!w) {
#if QT_CONFIG(toolbutton)
        QLineEditIconButton *toolButton = new QLineEditIconButton(q);
        toolButton->setIcon(newAction->icon());
        toolButton->setOpacity(lastTextSize > 0 || !(flags & SideWidgetFadeInWithText) ? 1 : 0);
        if (flags & SideWidgetClearButton) {
            QObjectPrivate::connect(toolButton, &QToolButton::clicked,
                                    this, &QLineEditPrivate::clearButtonClicked);

#if QT_CONFIG(animation)
            // The clear button is handled only by this widget. The button should be really
            // shown/hidden in order to calculate size hints correctly.
            toolButton->setHideWithText(true);
#endif
        }
        toolButton->setDefaultAction(newAction);
        w = toolButton;
#else
        return nullptr;
#endif
    }

    // QTBUG-59957: clear button should be the leftmost action.
    if (!before && !(flags & SideWidgetClearButton) && position == QLineEdit::TrailingPosition) {
        for (const SideWidgetEntry &e : trailingSideWidgets) {
            if (e.flags & SideWidgetClearButton) {
                before = e.action;
                break;
            }
        }
    }

    // If there is a 'before' action, it takes preference

    // There's a bug in GHS compiler that causes internal error on the following code.
    // The affected GHS compiler versions are 2016.5.4 and 2017.1. GHS internal reference
    // to track the progress of this issue is TOOLS-26637.
    // This temporary workaround allows to compile with GHS toolchain and should be
    // removed when GHS provides a patch to fix the compiler issue.

#if defined(Q_CC_GHS)
    const SideWidgetLocation loc = {position, -1};
    const auto location = before ? findSideWidget(before) : loc;
#else
    const auto location = before ? findSideWidget(before) : SideWidgetLocation{position, -1};
#endif

    SideWidgetEntryList &list = location.position == QLineEdit::TrailingPosition ? trailingSideWidgets : leadingSideWidgets;
    list.insert(location.isValid() ? list.begin() + location.index : list.end(),
                SideWidgetEntry(w, newAction, flags));
    positionSideWidgets();
    w->show();
    return w;
}